

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

void indexLevels(xformDatabase *xdb)

{
  int iVar1;
  transformData *ptVar2;
  long lVar3;
  
  if (xdb != (xformDatabase *)0x0) {
    iVar1 = 0;
    for (ptVar2 = xdb->xforms; ptVar2 != (transformData *)0x0; ptVar2 = ptVar2->next) {
      if (ptVar2->type - 1U < 2) {
        ptVar2->num = iVar1;
        lVar3 = (long)iVar1;
        iVar1 = iVar1 + 1;
        xdb->level[lVar3] = ptVar2;
      }
    }
    xdb->nlevs = iVar1;
  }
  return;
}

Assistant:

void indexLevels(xformDatabase* xdb) {
   transformData* xform = NULL;
   int n = 0;
   
   if (xdb) {
      n = 0;
      for(xform = xdb->xforms; xform; xform = xform->next) {
         if (xform->type == ROTxform || xform->type == TRANSxform) {
            /* the NULL transformation does not get indexed (it is not a scan dimension) */
	    xform->num = n;
            xdb->level[n++] = xform;
         }
      }
      xdb->nlevs = n;
   }
}